

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_item_t_conflict
MIR_new_ref_data(MIR_context_t ctx,char *name,MIR_item_t_conflict ref_item,int64_t disp)

{
  MIR_ref_data_t pMVar1;
  MIR_error_func_t p_Var2;
  MIR_item_t_conflict pMVar3;
  char *local_50;
  MIR_ref_data_t ref_data;
  MIR_item_t_conflict item;
  MIR_item_t_conflict tab_item;
  int64_t disp_local;
  MIR_item_t_conflict ref_item_local;
  char *name_local;
  MIR_context_t ctx_local;
  
  ref_data = (MIR_ref_data_t)create_item(ctx,MIR_ref_data_item,"ref data");
  pMVar1 = (MIR_ref_data_t)malloc(0x20);
  (((MIR_item_t_conflict)ref_data)->u).ref_data = pMVar1;
  if (pMVar1 == (MIR_ref_data_t)0x0) {
    free(ref_data);
    p_Var2 = MIR_get_error_func(ctx);
    local_50 = name;
    if (name == (char *)0x0) {
      local_50 = "";
    }
    (*p_Var2)(MIR_alloc_error,"Not enough memory for creation of ref data %s",local_50);
  }
  ref_item_local = (MIR_item_t_conflict)name;
  if (name != (char *)0x0) {
    ref_item_local = (MIR_item_t_conflict)get_ctx_str(ctx,name);
  }
  pMVar1->name = (char *)ref_item_local;
  pMVar1->ref_item = ref_item;
  pMVar1->disp = disp;
  if (ref_item_local == (MIR_item_t_conflict)0x0) {
    DLIST_MIR_item_t_append(&ctx->curr_module->items,(MIR_item_t_conflict)ref_data);
  }
  else {
    pMVar3 = add_item(ctx,(MIR_item_t_conflict)ref_data);
    if (pMVar3 != (MIR_item_t_conflict)ref_data) {
      free(ref_data);
      ref_data = (MIR_ref_data_t)pMVar3;
    }
  }
  return (MIR_item_t_conflict)ref_data;
}

Assistant:

MIR_item_t MIR_new_ref_data (MIR_context_t ctx, const char *name, MIR_item_t ref_item,
                             int64_t disp) {
  MIR_item_t tab_item, item = create_item (ctx, MIR_ref_data_item, "ref data");
  MIR_ref_data_t ref_data;

  item->u.ref_data = ref_data = malloc (sizeof (struct MIR_ref_data));
  if (ref_data == NULL) {
    free (item);
    MIR_get_error_func (ctx) (MIR_alloc_error, "Not enough memory for creation of ref data %s",
                              name == NULL ? "" : name);
  }
  if (name != NULL) name = get_ctx_str (ctx, name);
  ref_data->name = name;
  ref_data->ref_item = ref_item;
  ref_data->disp = disp;
  if (name == NULL) {
    DLIST_APPEND (MIR_item_t, curr_module->items, item);
  } else if ((tab_item = add_item (ctx, item)) != item) {
    free (item);
    item = tab_item;
  }
  return item;
}